

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void throw_net_err(char *msg,int sock_err)

{
  int in_ESI;
  char *in_RDI;
  int argc;
  CVmRun *unaff_retaddr;
  vm_obj_id_t cl;
  vm_obj_id_t vVar1;
  
  vVar1 = 0;
  if (in_ESI == 0x67 || in_ESI == 0x68) {
    vVar1 = G_predef_X.net_reset_exception;
  }
  if (vVar1 == 0) {
    vVar1 = G_predef_X.net_exception;
  }
  if (in_ESI != 0) {
    CVmRun::push_int((CVmRun *)CONCAT44(in_ESI,vVar1),1);
  }
  CVmRun::push_string(unaff_retaddr,in_RDI);
  CVmRun::throw_new_class
            (unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI,
             (char *)CONCAT44(in_ESI,vVar1));
  return;
}

Assistant:

static void throw_net_err(VMG_ const char *msg, int sock_err)
{
    /* 
     *   Determine the exception class, based on the error code:
     *   
     *.  - ECONNRESET -> SocketDisconnectException
     *.  - everything else -> the base NetException
     */
    vm_obj_id_t cl = VM_INVALID_OBJ;
    switch (sock_err)
    {
    case OS_ECONNRESET:
    case OS_ECONNABORTED:
        cl = G_predef->net_reset_exception;
        break;
    }

    /* 
     *   if we didn't pick a special class for the error, or the class we
     *   selected wasn't imported, use the base NetException class by default
     */
    if (cl == VM_INVALID_OBJ)
        cl = G_predef->net_exception;

    /* throw new exceptionClass(msg, errno) */
    int argc = 1;
    if (sock_err != 0)
    {
        G_stk->push_int(vmg_ sock_err);
        ++argc;
    }
    G_interpreter->push_string(vmg_ msg);
    G_interpreter->throw_new_class(vmg_ cl, argc, msg);
}